

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cc
# Opt level: O2

void __thiscall OptStrTokIter::OptStrTokIter(OptStrTokIter *this,char *tokens,char *delimiters)

{
  size_t sVar1;
  pointer __p_00;
  char *pcVar2;
  pointer __p;
  ulong __n;
  __uniq_ptr_impl<char,_std::default_delete<char[]>_> local_28;
  
  (this->super_OptIterRwd).super_OptIter._vptr_OptIter = (_func_int **)&PTR__OptStrTokIter_00341fa8;
  sVar1 = strlen(tokens);
  this->len = (uint)sVar1;
  this->str = tokens;
  this->seps = delimiters;
  this->cur = (char *)0x0;
  (this->tokstr)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (char *)0x0;
  if (delimiters == (char *)0x0) {
    this->seps = default_delims;
  }
  __n = (ulong)((uint)sVar1 + 1);
  __p_00 = (pointer)operator_new__(__n);
  memset(__p_00,0,__n);
  local_28._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
  super__Head_base<0UL,_char_*,_false>._M_head_impl =
       (tuple<char_*,_std::default_delete<char[]>_>)
       (_Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>)0x0;
  std::__uniq_ptr_impl<char,_std::default_delete<char[]>_>::reset
            ((__uniq_ptr_impl<char,_std::default_delete<char[]>_> *)&this->tokstr,__p_00);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_28);
  strcpy((this->tokstr)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
         super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl,this->str);
  pcVar2 = strtok((this->tokstr)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t
                  .super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                  super__Head_base<0UL,_char_*,_false>._M_head_impl,this->seps);
  this->cur = pcVar2;
  return;
}

Assistant:

OptStrTokIter::OptStrTokIter(const char * tokens, const char * delimiters)
   : len(unsigned(strlen(tokens))), str(tokens), seps(delimiters),
     cur(NULLSTR)
{
   if (seps == NULL)  seps = default_delims;
   tokstr = std::make_unique<char[]>(len + 1);
   (void) strcpy(tokstr.get(), str);
   cur = strtok(tokstr.get(), seps);
}